

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_add_serverhello_tlsext(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl;
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  undefined **ppuVar6;
  bool bVar7;
  CBB extensions;
  CBB local_60;
  
  ssl = hs->ssl;
  iVar3 = CBB_add_u16_length_prefixed(out,&local_60);
  if (iVar3 == 0) {
LAB_00139ee1:
    bVar7 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xfb2);
  }
  else {
    ppuVar6 = &PTR_ext_sni_add_serverhello_002d33a0;
    lVar5 = 0;
    do {
      if (((hs->extensions).sent >> ((uint)lVar5 & 0x1f) & 1) != 0) {
        cVar1 = (*(code *)*ppuVar6)(hs);
        if (cVar1 == '\0') {
          ERR_put_error(0x10,0,0x93,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0xfa3);
          ERR_add_error_dataf("extension %u");
          goto LAB_00139ee1;
        }
      }
      lVar5 = lVar5 + 1;
      ppuVar6 = ppuVar6 + 5;
    } while (lVar5 != 0x1c);
    uVar2 = ssl_protocol_version(ssl);
    if (uVar2 < 0x304) {
      sVar4 = CBB_len(&local_60);
      if (sVar4 == 0) {
        CBB_discard_child(out);
      }
    }
    iVar3 = CBB_flush(out);
    bVar7 = iVar3 != 0;
  }
  return bVar7;
}

Assistant:

bool ssl_add_serverhello_tlsext(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  CBB extensions;
  if (!CBB_add_u16_length_prefixed(out, &extensions)) {
    goto err;
  }

  for (unsigned i = 0; i < kNumExtensions; i++) {
    if (!(hs->extensions.received & (1u << i))) {
      // Don't send extensions that were not received.
      continue;
    }

    if (!kExtensions[i].add_serverhello(hs, &extensions)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_ADDING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      goto err;
    }
  }

  // Discard empty extensions blocks before TLS 1.3.
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION &&  //
      CBB_len(&extensions) == 0) {
    CBB_discard_child(out);
  }

  return CBB_flush(out);

err:
  OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
  return false;
}